

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationXX.hpp
# Opt level: O0

RotationXX<std::complex<double>_> *
qclab::qgates::operator*
          (RotationXX<std::complex<double>_> *__return_storage_ptr__,
          RotationXX<std::complex<double>_> *lhs,RotationXX<std::complex<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  RotationXX<std::complex<double>_> *rhs_local;
  RotationXX<std::complex<double>_> *lhs_local;
  
  iVar1 = QRotationGate2<std::complex<double>_>::qubit
                    (&lhs->super_QRotationGate2<std::complex<double>_>);
  iVar2 = (*(rhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationXX<std::complex<double>_>::operator*=(lhs,rhs);
    RotationXX<std::complex<double>_>::RotationXX(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationXX.hpp"
                ,0xca,"RotationXX<T> qclab::qgates::operator*(RotationXX<T>, const RotationXX<T> &)"
               );
}

Assistant:

RotationXX< T > operator*( RotationXX< T > lhs ,
                                         const RotationXX< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }